

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIImageList::draw(CGUIImageList *this,s32 index,vector2d<int> *destPos,rect<int> *clip)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  rect<int> sourceRect;
  rect<int> *in_stack_ffffffffffffffa0;
  long *plVar2;
  SColor local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  core::rect<int>::rect(in_stack_ffffffffffffffa0);
  if (((*(long *)(in_RDI + 8) != 0) && (-1 < local_c)) && (local_c < *(int *)(in_RDI + 0x18))) {
    local_30 = (local_c % *(int *)(in_RDI + 0x24)) * *(int *)(in_RDI + 0x1c);
    local_2c = (local_c / *(int *)(in_RDI + 0x24)) * *(int *)(in_RDI + 0x20);
    local_28 = local_30 + *(int *)(in_RDI + 0x1c);
    local_24 = local_2c + *(int *)(in_RDI + 0x20);
    plVar2 = *(long **)(in_RDI + 8);
    uVar1 = *(undefined8 *)(in_RDI + 0x10);
    video::SColor::SColor(&local_34,0xff,0xff,0xff,0xff);
    (**(code **)(*plVar2 + 0x180))
              (plVar2,uVar1,local_18,&local_30,local_20,local_34.color,*(byte *)(in_RDI + 0x28) & 1)
    ;
  }
  return;
}

Assistant:

void CGUIImageList::draw(s32 index, const core::position2d<s32> &destPos,
		const core::rect<s32> *clip /*= 0*/)
{
	core::rect<s32> sourceRect;

	if (!Driver || index < 0 || index >= ImageCount) {
		return;
	}

	sourceRect.UpperLeftCorner.X = (index % ImagesPerRow) * ImageSize.Width;
	sourceRect.UpperLeftCorner.Y = (index / ImagesPerRow) * ImageSize.Height;
	sourceRect.LowerRightCorner.X = sourceRect.UpperLeftCorner.X + ImageSize.Width;
	sourceRect.LowerRightCorner.Y = sourceRect.UpperLeftCorner.Y + ImageSize.Height;

	Driver->draw2DImage(Texture, destPos, sourceRect, clip,
			video::SColor(255, 255, 255, 255), UseAlphaChannel);
}